

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupEnded(XmlReporter *this,TestGroupStats *testGroupStats)

{
  ScopedElement *pSVar1;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  TestGroupStats *local_18;
  TestGroupStats *testGroupStats_local;
  XmlReporter *this_local;
  
  local_18 = testGroupStats;
  testGroupStats_local = (TestGroupStats *)this;
  StreamingReporterBase::testGroupEnded(&this->super_StreamingReporterBase,testGroupStats);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"OverallResults",&local_41);
  XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffe0,(string *)&this->m_xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"successes",&local_79);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     ((ScopedElement *)&stack0xffffffffffffffe0,(string *)local_78,
                      (unsigned_long *)&local_18->totals);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"failures",&local_a1);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                     (pSVar1,(string *)local_a0,&(local_18->totals).assertions.failed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"expectedFailures",&local_c9);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (pSVar1,(string *)local_c8,&(local_18->totals).assertions.failedButOk);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffe0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& testGroupStats ) {
            StreamingReporterBase::testGroupEnded( testGroupStats );
            // TODO: Check testGroupStats.aborting and act accordingly.
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", testGroupStats.totals.assertions.passed )
                .writeAttribute( "failures", testGroupStats.totals.assertions.failed )
                .writeAttribute( "expectedFailures", testGroupStats.totals.assertions.failedButOk );
            m_xml.endElement();
        }